

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserException.cpp
# Opt level: O2

string * ninx::parser::exception::ParserException::make_message
                   (string *__return_storage_ptr__,int line,string *origin,string *message)

{
  ostream *poVar1;
  char *pcVar2;
  stringstream s;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = local_1a0;
  if (line < 1) {
    pcVar2 = "ParserError at EOF: ";
  }
  else {
    poVar1 = std::operator<<(poVar1,"ParserError at line: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
    pcVar2 = " ";
  }
  std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(local_1a0,(string *)message);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1a0,"\tfrom origin: ");
  std::operator<<(poVar1,(string *)origin);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string
ninx::parser::exception::ParserException::make_message(int line, const std::string &origin, const std::string &message) {
    std::stringstream s;

    if (line > 0) {  // Error was found in a specific line
        s << "ParserError at line: " << line << " ";
    }else{   // the error was generated by encountering the end of file when unexpected.
        s << "ParserError at EOF: ";
    }

    s << message << std::endl;
    s << "\tfrom origin: " << origin;
    return s.str();
}